

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionRayleighAdvancedGeneric::ComputeQuadraticTerms
          (ChBeamSectionRayleighAdvancedGeneric *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVector<double> local_78;
  undefined1 local_60 [24];
  ChVector<double> local_48;
  
  dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = (this->super_ChBeamSectionEulerAdvancedGeneric).My;
  local_48.m_data[2] = (this->super_ChBeamSectionEulerAdvancedGeneric).Mz;
  Vcross<double,double>(mW,&local_48);
  Vcross<double,double>(mW,(ChVector<double> *)local_60);
  dVar3 = dVar1 * local_78.m_data[2];
  mF->m_data[0] = dVar1 * local_78.m_data[0];
  mF->m_data[1] = dVar1 * local_78.m_data[1];
  mF->m_data[2] = dVar3;
  (*(this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.super_ChBeamSection.
    _vptr_ChBeamSection[0xc])(this);
  local_60._0_8_ = dVar3 * mW->m_data[0];
  dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).super_ChBeamSectionEuler.JzzJyy_factor;
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  dVar1 = (this->super_ChBeamSectionEulerAdvancedGeneric).mu;
  auVar5._8_8_ = dVar1;
  auVar5._0_8_ = dVar1;
  auVar2._0_8_ = this->Jzz;
  auVar2._8_8_ = this->Jyy;
  auVar4 = vfmadd213pd_fma(auVar5,auVar4,auVar2);
  auVar2 = *(undefined1 (*) [16])(mW->m_data + 1);
  auVar4 = vshufpd_avx(auVar4,auVar4,1);
  auVar5 = vshufpd_avx(auVar2,auVar2,1);
  auVar6._0_8_ = auVar5._0_8_ * this->Jyz;
  auVar6._8_8_ = auVar5._8_8_ * this->Jyz;
  local_60._8_16_ = vfmsub231pd_fma(auVar6,auVar2,auVar4);
  Vcross<double,double>(mW,(ChVector<double> *)local_60);
  if (&local_78 != mT) {
    mT->m_data[0] = local_78.m_data[0];
    mT->m_data[1] = local_78.m_data[1];
    mT->m_data[2] = local_78.m_data[2];
  }
  return;
}

Assistant:

void ChBeamSectionRayleighAdvancedGeneric::ComputeQuadraticTerms(ChVector<>& mF,   ///< centrifugal term (if any) returned here
		ChVector<>& mT,                ///< gyroscopic term  returned here
		const ChVector<>& mW           ///< current angular velocity of section, in material frame
	) {
		 // F_centrifugal = density_per_unit_length w X w X c 
		mF = this->mu * Vcross(mW,Vcross(mW,ChVector<>(0,this->My,this->Mz)));

		// unroll the product [J] * w  in the expression w X [J] * w  as 4 values of [J] are zero anyway
		mT = Vcross(mW, ChVector<>( this->GetInertiaJxxPerUnitLength()*mW.x(),
									(this->Jyy + JzzJyy_factor * this->mu)*mW.y() - this->Jyz*mW.z(),
									(this->Jzz + JzzJyy_factor * this->mu)*mW.z() - this->Jyz*mW.y() )  );
	}